

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

void bin_linear(IntVar *x,IntVar *y,IntRelType t,int c)

{
  undefined8 extraout_RAX;
  int c_00;
  ulong uVar1;
  IntRelType t_00;
  ulong uVar2;
  longdouble ub;
  longdouble lb;
  IntView<0> x_00;
  IntView<0> y_00;
  vec<int> local_58;
  vec<IntVar_*> local_48;
  IntVar *local_38;
  IntVar *local_30;
  
  local_38 = y;
  local_30 = x;
  if (IRT_GT < t) goto switchD_001b0594_caseD_1;
  switch(t) {
  case IRT_EQ:
    bin_linear(x,y,IRT_LE,c);
    t_00 = IRT_GE;
    c_00 = c;
    break;
  case IRT_NE:
    goto switchD_001b0594_caseD_1;
  case IRT_LE:
    uVar2 = (ulong)(uint)c << 0x20 | 0xffffffff;
    uVar1 = 1;
    goto LAB_001b0614;
  case IRT_LT:
    t_00 = IRT_LE;
    c_00 = c + -1;
    break;
  case IRT_GE:
    uVar1 = (ulong)(uint)c << 0x20 | 0xffffffff;
    uVar2 = 1;
LAB_001b0614:
    x_00.a = (int)uVar2;
    x_00.b = (int)(uVar2 >> 0x20);
    x_00.var = x;
    y_00.a = (int)uVar1;
    y_00.b = (int)(uVar1 >> 0x20);
    y_00.var = y;
    newBinGE(x_00,y_00,&bv_true);
    goto LAB_001b061f;
  case IRT_GT:
    t_00 = IRT_GE;
    c_00 = c + 1;
  }
  bin_linear(x,y,t_00,c_00);
LAB_001b061f:
  local_58.sz = 2;
  local_58.cap = 2;
  local_58.data = (int *)malloc(8);
  local_58.data[0] = 1;
  local_58.data[1] = 1;
  local_48.sz = 0;
  local_48.cap = 0;
  local_48.data = (IntVar **)0x0;
  vec<IntVar_*>::push(&local_48,&local_30);
  vec<IntVar_*>::push(&local_48,&local_38);
  switch(t) {
  case IRT_EQ:
  case IRT_LT:
  case IRT_GT:
    goto switchD_001b0683_caseD_0;
  default:
    bin_linear();
switchD_001b0594_caseD_1:
    bin_linear();
    if (local_48.data != (IntVar **)0x0) {
      free(local_48.data);
    }
    if (local_58.data != (int *)0x0) {
      free(local_58.data);
    }
    _Unwind_Resume(extraout_RAX);
  case IRT_LE:
    lb = (longdouble)-1e+100;
    ub = (longdouble)c;
    break;
  case IRT_GE:
    ub = (longdouble)1e+100;
    lb = (longdouble)c;
  }
  MIP::addConstraint(mip,&local_58,&local_48,lb,ub);
switchD_001b0683_caseD_0:
  if (local_48.data != (IntVar **)0x0) {
    free(local_48.data);
  }
  if (local_58.data != (int *)0x0) {
    free(local_58.data);
  }
  return;
}

Assistant:

void bin_linear(IntVar* x, IntVar* y, IntRelType t, int c) {
	switch (t) {
		case IRT_EQ:
			bin_linear(x, y, IRT_LE, c);
			bin_linear(x, y, IRT_GE, c);
			break;
		case IRT_LE:
			// x + y <= c <=> (-x+c) >= y
			newBinGE(IntView<>(x, -1, c), IntView<>(y));
			break;
		case IRT_LT:
			bin_linear(x, y, IRT_LE, c - 1);
			break;
		case IRT_GE:
			// x + y >= c <=> x >= (-y+c)
			newBinGE(IntView<>(x), IntView<>(y, -1, c));
			break;
		case IRT_GT:
			bin_linear(x, y, IRT_GE, c + 1);
			break;
		default:
			NEVER;
	}

	vec<int> coeffs(2, 1);
	vec<IntVar*> vars;

	vars.push(x);
	vars.push(y);

	switch (t) {
		case IRT_EQ:
			break;
		case IRT_LE:
			mip->addConstraint(coeffs, vars, -1e100, c);
			break;
		case IRT_LT:
			break;
		case IRT_GE:
			mip->addConstraint(coeffs, vars, c, 1e100);
			break;
		case IRT_GT:
			break;
		default:
			NEVER;
	}
}